

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void demmt_sync(mmt_sync *o,void *state)

{
  int iVar1;
  ssize_t sVar2;
  int local_1c;
  int r;
  int cnt;
  void *state_local;
  mmt_sync *o_local;
  
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    fdatasync(1);
    local_1c = 4;
    while (local_1c != 0) {
      sVar2 = write(mmt_sync_fd,(void *)((long)o + (5 - (long)local_1c)),(long)local_1c);
      iVar1 = (int)sVar2;
      if (iVar1 < 1) {
        if (iVar1 != 4) {
          demmt_abort();
        }
      }
      else {
        local_1c = local_1c - iVar1;
      }
    }
    fdatasync(mmt_sync_fd);
  }
  return;
}

Assistant:

static void demmt_sync(struct mmt_sync *o, void *state)
{
	if (mmt_sync_fd == -1)
		return;

	fflush(stdout);
	fdatasync(1);
	int cnt = 4;
	while (cnt)
	{
		int r = write(mmt_sync_fd, ((char *)&o->id) + 4 - cnt, cnt);
		if (r > 0)
			cnt -= r;
		else if (r != EINTR)
			demmt_abort();
	}
	fdatasync(mmt_sync_fd);
}